

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O1

void __thiscall
CDirectiveFile::initCopy(CDirectiveFile *this,path *inputName,path *outputName,int64_t memory)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  FileManager *this_01;
  GenericAssemblerFile *pGVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  path fullOutputName;
  path fullInputName;
  undefined1 local_79;
  GenericAssemblerFile *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  shared_ptr<AssemblerFile> local_68;
  int64_t local_58;
  path local_50;
  path local_30;
  
  *(undefined4 *)&(this->super_CAssemblerCommand).field_0x14 = 3;
  local_58 = memory;
  getFullPathName(&local_30,inputName);
  getFullPathName(&local_50,outputName);
  local_78 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<GenericAssemblerFile,std::allocator<GenericAssemblerFile>,ghc::filesystem::path&,ghc::filesystem::path&,long&>
            (&_Stack_70,&local_78,(allocator<GenericAssemblerFile> *)&local_79,&local_50,&local_30,
             &local_58);
  _Var2._M_pi = _Stack_70._M_pi;
  pGVar1 = local_78;
  local_78 = (GenericAssemblerFile *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pGVar1;
  (this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
  }
  this_01 = g_fileManager;
  local_68.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_AssemblerFile;
  local_68.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi;
  if (local_68.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_68.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_68.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  FileManager::addFile(this_01,&local_68);
  if (local_68.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  Global.Section = Global.Section + 1;
  (this->super_CAssemblerCommand).section = Global.Section;
  ghc::filesystem::path::~path(&local_50);
  ghc::filesystem::path::~path(&local_30);
  return;
}

Assistant:

void CDirectiveFile::initCopy(const fs::path& inputName, const fs::path& outputName, int64_t memory)
{
	type = Type::Copy;
	fs::path fullInputName = getFullPathName(inputName);
	fs::path fullOutputName = getFullPathName(outputName);
	
	file = std::make_shared<GenericAssemblerFile>(fullOutputName,fullInputName,memory);
	g_fileManager->addFile(file);

	updateSection(++Global.Section);
}